

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  ulong uVar6;
  uint16_t *puVar7;
  BrotliDictionary *pBVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  uint32_t uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint16_t uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  uint16_t *num;
  ulong local_128;
  uint local_110;
  ulong local_108;
  ulong local_f8;
  ulong local_d0;
  Command_conflict *local_c8;
  int local_a4;
  ulong local_98;
  int last_distance;
  HasherCommon *common;
  
  iVar24 = params->lgwin;
  uVar3 = (position - 3) + num_bytes;
  sVar16 = position;
  if (3 < num_bytes) {
    sVar16 = uVar3;
  }
  lVar17 = 0x200;
  if (params->quality < 9) {
    lVar17 = 0x40;
  }
  uVar31 = *last_insert_len;
  uVar1 = position + num_bytes;
  uVar36 = *(uint *)(hasher + 0x10);
  if (4 < (int)uVar36) {
    iVar25 = *dist_cache;
    dist_cache[4] = iVar25 + -1;
    dist_cache[5] = iVar25 + 1;
    dist_cache[6] = iVar25 + -2;
    dist_cache[7] = iVar25 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar25 + 3,iVar25 + -3);
    if (10 < uVar36) {
      iVar25 = dist_cache[1];
      dist_cache[10] = iVar25 + -1;
      dist_cache[0xb] = iVar25 + 1;
      dist_cache[0xc] = iVar25 + -2;
      dist_cache[0xd] = iVar25 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar25 + 3,iVar25 + -3);
    }
  }
  uVar4 = (1L << ((byte)iVar24 & 0x3f)) - 0x10;
  uVar14 = lVar17 + position;
  lVar2 = position - 1;
  local_c8 = commands;
LAB_0010f5a4:
LAB_0010f5b2:
  uVar30 = position;
  if (uVar1 <= uVar30 + 4) {
    *last_insert_len = (uVar31 + uVar1) - uVar30;
    *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
    return;
  }
  local_d0 = uVar1 - uVar30;
  uVar22 = uVar4;
  if (uVar30 < uVar4) {
    uVar22 = uVar30;
  }
  uVar6 = (params->dist).max_distance;
  uVar18 = uVar30 & ringbuffer_mask;
  piVar19 = (int *)(ringbuffer + uVar18);
  uVar12 = (ulong)((uint)local_d0 & 7);
  uVar40 = 0x7e4;
  uVar47 = 0;
  uVar38 = 0;
  uVar37 = 0;
  uVar39 = 0;
  do {
    if (uVar37 == (long)*(int *)(hasher + 0x10)) {
      uVar36 = (uint)(*piVar19 * 0x1e35a7bd) >> (hasher[0x38] & 0x1f);
      lVar45 = *(long *)(hasher + 0x28) * 2 + 0x40;
      lVar42 = (ulong)(uVar36 << (hasher[8] & 0x1f)) * 4 + lVar45;
      uVar5 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40);
      uVar20 = (ulong)uVar5;
      uVar37 = *(ulong *)(hasher + 0x30);
      uVar28 = 0;
      if (uVar37 <= uVar20) {
        uVar28 = uVar20 - uVar37;
      }
      do {
        local_f8 = uVar47;
        local_128 = uVar40;
        uVar11 = uVar38;
        uVar29 = uVar39;
        uVar34 = uVar29 + uVar18;
        do {
          do {
            do {
              do {
                if (uVar20 <= uVar28) {
LAB_0010f8fa:
                  *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar42) =
                       (int)uVar30;
                  *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40) = uVar5 + 1;
                  if (local_128 != 0x7e4) {
                    iVar24 = 0;
                    goto LAB_0010fb7e;
                  }
                  uVar39 = *(ulong *)(hasher + 0x18);
                  local_108 = *(ulong *)(hasher + 0x20);
                  if (local_108 < uVar39 >> 7) goto LAB_0010fb90;
                  uVar38 = (ulong)((uint)(*piVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar7 = (params->dictionary).hash_table;
                  iVar24 = 0;
                  local_128 = 0x7e4;
                  lVar42 = 0;
                  goto LAB_0010f999;
                }
                uVar20 = uVar20 - 1;
                uVar47 = uVar30 - *(uint *)(hasher + (ulong)((uint)uVar20 & *(uint *)(hasher + 0x3c)
                                                            ) * 4 + lVar42);
                if (uVar22 < uVar47) goto LAB_0010f8fa;
              } while (ringbuffer_mask < uVar34);
              uVar38 = (ulong)(*(uint *)(hasher + (ulong)((uint)uVar20 & *(uint *)(hasher + 0x3c)) *
                                                  4 + lVar42) & (uint)ringbuffer_mask);
              uVar39 = uVar38 + uVar29;
            } while ((ringbuffer_mask < uVar39) || (ringbuffer[uVar34] != ringbuffer[uVar39]));
            uVar39 = 0;
            lVar41 = 0;
LAB_0010f85f:
            uVar40 = local_d0 & 0xfffffffffffffff8;
            uVar23 = uVar12;
            if (local_d0 >> 3 == uVar39) {
              for (; (uVar39 = local_d0, uVar23 != 0 &&
                     (uVar39 = uVar40,
                     ringbuffer[uVar40 + uVar38] == *(uint8_t *)((long)piVar19 + uVar40)));
                  uVar40 = uVar40 + 1) {
                uVar23 = uVar23 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar19 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + uVar38))
              goto code_r0x0010f878;
              uVar38 = *(ulong *)(ringbuffer + uVar39 * 8 + uVar38) ^
                       *(ulong *)(piVar19 + uVar39 * 2);
              uVar39 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar41;
            }
          } while (uVar39 < 4);
          iVar24 = 0x1f;
          if ((uint)uVar47 != 0) {
            for (; (uint)uVar47 >> iVar24 == 0; iVar24 = iVar24 + -1) {
            }
          }
          uVar40 = (ulong)(iVar24 * -0x1e + 0x780) + uVar39 * 0x87;
          uVar38 = uVar39;
        } while (uVar40 <= local_128);
      } while( true );
    }
    uVar28 = (ulong)dist_cache[uVar37];
    if (((uVar28 <= uVar22) && (uVar30 - uVar28 < uVar30)) && (uVar39 + uVar18 <= ringbuffer_mask))
    {
      uVar20 = uVar30 - uVar28 & ringbuffer_mask;
      if ((uVar20 + uVar39 <= ringbuffer_mask) &&
         (ringbuffer[uVar39 + uVar18] == ringbuffer[uVar20 + uVar39])) {
        uVar34 = 0;
        lVar45 = 0;
LAB_0010f69d:
        uVar11 = uVar12;
        uVar29 = local_d0 & 0xfffffffffffffff8;
        if (local_d0 >> 3 == uVar34) {
          for (; (uVar34 = local_d0, uVar11 != 0 &&
                 (uVar34 = uVar29,
                 ringbuffer[uVar29 + uVar20] == *(uint8_t *)((long)piVar19 + uVar29)));
              uVar29 = uVar29 + 1) {
            uVar11 = uVar11 - 1;
          }
        }
        else {
          if (*(ulong *)(piVar19 + uVar34 * 2) == *(ulong *)(ringbuffer + uVar34 * 8 + uVar20))
          goto code_r0x0010f6ba;
          uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + uVar20) ^ *(ulong *)(piVar19 + uVar34 * 2);
          uVar20 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar34 = (uVar20 >> 3 & 0x1fffffff) - lVar45;
        }
        if (((2 < uVar34) || ((uVar37 < 2 && (uVar34 == 2)))) &&
           (uVar20 = uVar34 * 0x87 + 0x78f, uVar40 < uVar20)) {
          if (uVar37 != 0) {
            uVar20 = uVar20 - ((0x1ca10U >> ((byte)uVar37 & 0xe) & 0xe) + 0x27);
          }
          if (uVar40 < uVar20) {
            uVar39 = uVar34;
            uVar38 = uVar34;
            uVar40 = uVar20;
            uVar47 = uVar28;
          }
        }
      }
    }
    uVar37 = uVar37 + 1;
  } while( true );
LAB_0010f999:
  if (lVar42 == 2) goto LAB_0010fb7e;
  uVar5 = puVar7[uVar38];
  uVar39 = uVar39 + 1;
  *(ulong *)(hasher + 0x18) = uVar39;
  if (uVar5 != 0) {
    uVar36 = uVar5 & 0x1f;
    uVar40 = (ulong)uVar36;
    if (uVar40 <= local_d0) {
      pBVar8 = (params->dictionary).words;
      lVar41 = (ulong)pBVar8->offsets_by_length[uVar40] + uVar40 * (uVar5 >> 5);
      uVar18 = (ulong)(uVar5 & 0x18);
      uVar47 = 0;
LAB_0010fa13:
      if ((uVar5 & 0x18) == uVar47) {
        uVar12 = (ulong)(uVar5 & 7);
        puVar21 = pBVar8->data + uVar47 + lVar41;
        for (; (bVar48 = uVar12 != 0, uVar12 = uVar12 - 1, uVar47 = (ulong)(uVar5 & 0x1f), bVar48 &&
               (uVar47 = uVar18, *(uint8_t *)((long)piVar19 + uVar18) == *puVar21));
            uVar18 = uVar18 + 1) {
          puVar21 = puVar21 + 1;
        }
      }
      else {
        uVar12 = *(ulong *)(pBVar8->data + uVar47 + lVar41);
        if (uVar12 == *(ulong *)((long)piVar19 + uVar47)) goto code_r0x0010fa2e;
        uVar12 = *(ulong *)((long)piVar19 + uVar47) ^ uVar12;
        uVar18 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar47 = (uVar18 >> 3 & 0x1fffffff) + uVar47;
      }
      if (((uVar47 != 0) && (uVar40 < (params->dictionary).cutoffTransformsCount + uVar47)) &&
         (uVar40 = (ulong)(uVar5 >> 5) + uVar22 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar40 - uVar47) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar40 - uVar47) * 4 << (pBVar8->size_bits_by_length[uVar40] & 0x3f)),
         uVar40 <= uVar6)) {
        iVar25 = 0x1f;
        if ((uint)uVar40 != 0) {
          for (; (uint)uVar40 >> iVar25 == 0; iVar25 = iVar25 + -1) {
          }
        }
        uVar18 = (uVar47 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
        if (local_128 <= uVar18) {
          iVar24 = uVar36 - (int)uVar47;
          local_108 = local_108 + 1;
          *(ulong *)(hasher + 0x20) = local_108;
          local_128 = uVar18;
          local_f8 = uVar40;
          uVar11 = uVar47;
        }
      }
    }
  }
  lVar42 = lVar42 + 1;
  uVar38 = uVar38 + 1;
  goto LAB_0010f999;
LAB_0010fb7e:
  if (local_128 < 0x7e5) {
LAB_0010fb90:
    uVar31 = uVar31 + 1;
    position = uVar30 + 1;
    if (uVar14 < position) {
      if (uVar14 + (uint)((int)lVar17 * 4) < position) {
        uVar22 = uVar30 + 0x11;
        if (uVar1 - 4 <= uVar30 + 0x11) {
          uVar22 = uVar1 - 4;
        }
        for (; position < uVar22; position = position + 4) {
          uVar36 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (hasher[0x38] & 0x1f);
          uVar5 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40);
          *(int *)(hasher + (ulong)(uVar36 << (hasher[8] & 0x1f)) * 4 +
                            (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar45) =
               (int)position;
          *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40) = uVar5 + 1;
          uVar31 = uVar31 + 4;
        }
      }
      else {
        uVar22 = uVar30 + 9;
        if (uVar3 <= uVar30 + 9) {
          uVar22 = uVar3;
        }
        for (; position < uVar22; position = position + 2) {
          uVar36 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (hasher[0x38] & 0x1f);
          uVar5 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40);
          *(int *)(hasher + (ulong)(uVar36 << (hasher[8] & 0x1f)) * 4 +
                            (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar45) =
               (int)position;
          *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40) = uVar5 + 1;
          uVar31 = uVar31 + 2;
        }
      }
    }
    goto LAB_0010f5b2;
  }
  uVar22 = (lVar2 + num_bytes) - uVar30;
  local_a4 = 0;
  uVar14 = uVar31;
LAB_0010fca1:
  uVar38 = (ulong)((uint)uVar22 & 7);
  local_d0 = local_d0 - 1;
  uVar39 = uVar11 - 1;
  if (local_d0 <= uVar11 - 1) {
    uVar39 = local_d0;
  }
  if (4 < params->quality) {
    uVar39 = 0;
  }
  uVar40 = uVar30 + 1;
  uVar47 = uVar4;
  if (uVar40 < uVar4) {
    uVar47 = uVar40;
  }
  uVar20 = uVar40 & ringbuffer_mask;
  piVar19 = (int *)(ringbuffer + uVar20);
  uVar18 = 0x7e4;
  uVar12 = 0;
  uVar28 = 0;
  uVar34 = 0;
  do {
    if (uVar34 == (long)*(int *)(hasher + 0x10)) {
      uVar36 = (uint)(*piVar19 * 0x1e35a7bd) >> (hasher[0x38] & 0x1f);
      lVar42 = (ulong)(uVar36 << (hasher[8] & 0x1f)) * 4 + lVar45;
      uVar5 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40);
      uVar29 = (ulong)uVar5;
      uVar34 = 0;
      if (uVar37 <= uVar29) {
        uVar34 = uVar29 - uVar37;
      }
      do {
        uVar43 = uVar39;
        uVar13 = uVar28;
        uVar44 = uVar12;
        uVar46 = uVar18;
        uVar23 = uVar43 + uVar20;
        do {
          do {
            do {
              do {
                if (uVar29 <= uVar34) {
LAB_0010ffbe:
                  *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar42) =
                       (int)uVar40;
                  *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40) = uVar5 + 1;
                  iVar25 = 0;
                  if (uVar46 != 0x7e4) goto LAB_0011025b;
                  uVar39 = *(ulong *)(hasher + 0x18);
                  local_98 = *(ulong *)(hasher + 0x20);
                  uVar46 = 0x7e4;
                  if (uVar39 >> 7 <= local_98) {
                    uVar38 = (ulong)((uint)(*piVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar7 = (params->dictionary).hash_table;
                    iVar25 = 0;
                    lVar42 = 0;
                    goto LAB_001100a5;
                  }
                  iVar25 = 0;
                  goto LAB_0011025b;
                }
                uVar29 = uVar29 - 1;
                uVar12 = uVar40 - *(uint *)(hasher + (ulong)((uint)uVar29 & *(uint *)(hasher + 0x3c)
                                                            ) * 4 + lVar42);
                if (uVar47 < uVar12) goto LAB_0010ffbe;
              } while (ringbuffer_mask < uVar23);
              uVar18 = (ulong)(*(uint *)(hasher + (ulong)((uint)uVar29 & *(uint *)(hasher + 0x3c)) *
                                                  4 + lVar42) & (uint)ringbuffer_mask);
              uVar39 = uVar18 + uVar43;
            } while ((ringbuffer_mask < uVar39) || (ringbuffer[uVar23] != ringbuffer[uVar39]));
            uVar39 = 0;
            lVar41 = 0;
LAB_0010ff37:
            if (uVar22 >> 3 == uVar39) {
              uVar39 = uVar38;
              for (uVar28 = -lVar41;
                  (bVar48 = uVar39 != 0, uVar39 = uVar39 - 1, bVar48 &&
                  (ringbuffer[uVar28 + uVar18] == *(uint8_t *)((long)piVar19 + uVar28)));
                  uVar28 = uVar28 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar19 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + uVar18))
              goto code_r0x0010ff4f;
              uVar18 = *(ulong *)(ringbuffer + uVar39 * 8 + uVar18) ^
                       *(ulong *)(piVar19 + uVar39 * 2);
              uVar39 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar28 = (uVar39 >> 3 & 0x1fffffff) - lVar41;
            }
          } while (uVar28 < 4);
          iVar25 = 0x1f;
          if ((uint)uVar12 != 0) {
            for (; (uint)uVar12 >> iVar25 == 0; iVar25 = iVar25 + -1) {
            }
          }
          uVar18 = (ulong)(iVar25 * -0x1e + 0x780) + uVar28 * 0x87;
          uVar39 = uVar28;
        } while (uVar18 <= uVar46);
      } while( true );
    }
    uVar29 = (ulong)dist_cache[uVar34];
    if (((uVar29 <= uVar47) && (uVar40 - uVar29 < uVar40)) && (uVar39 + uVar20 <= ringbuffer_mask))
    {
      uVar23 = uVar40 - uVar29 & ringbuffer_mask;
      if ((uVar23 + uVar39 <= ringbuffer_mask) &&
         (ringbuffer[uVar39 + uVar20] == ringbuffer[uVar23 + uVar39])) {
        uVar46 = 0;
        lVar42 = 0;
LAB_0010fd85:
        if (uVar22 >> 3 == uVar46) {
          uVar13 = uVar38;
          for (uVar46 = -lVar42;
              (bVar48 = uVar13 != 0, uVar13 = uVar13 - 1, bVar48 &&
              (ringbuffer[uVar46 + uVar23] == *(uint8_t *)((long)piVar19 + uVar46)));
              uVar46 = uVar46 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar19 + uVar46 * 2) == *(ulong *)(ringbuffer + uVar46 * 8 + uVar23))
          goto code_r0x0010fda6;
          uVar46 = *(ulong *)(ringbuffer + uVar46 * 8 + uVar23) ^ *(ulong *)(piVar19 + uVar46 * 2);
          uVar23 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar46 = (uVar23 >> 3 & 0x1fffffff) - lVar42;
        }
        if (((2 < uVar46) || ((uVar34 < 2 && (uVar46 == 2)))) &&
           (uVar23 = uVar46 * 0x87 + 0x78f, uVar18 < uVar23)) {
          if (uVar34 != 0) {
            uVar23 = uVar23 - ((0x1ca10U >> ((byte)uVar34 & 0xe) & 0xe) + 0x27);
          }
          if (uVar18 < uVar23) {
            uVar18 = uVar23;
            uVar12 = uVar29;
            uVar28 = uVar46;
            uVar39 = uVar46;
          }
        }
      }
    }
    uVar34 = uVar34 + 1;
  } while( true );
LAB_001100a5:
  if (lVar42 == 2) goto LAB_0011025b;
  uVar5 = puVar7[uVar38];
  uVar39 = uVar39 + 1;
  *(ulong *)(hasher + 0x18) = uVar39;
  if (uVar5 != 0) {
    uVar36 = uVar5 & 0x1f;
    uVar18 = (ulong)uVar36;
    if (uVar18 <= local_d0) {
      pBVar8 = (params->dictionary).words;
      lVar41 = (ulong)pBVar8->offsets_by_length[uVar18] + uVar18 * (uVar5 >> 5);
      uVar33 = (uint)uVar5;
      uVar28 = (ulong)(uVar33 & 0x18);
      uVar12 = 0;
LAB_00110129:
      if ((uVar5 & 0x18) == uVar12) {
        uVar20 = (ulong)(uVar33 & 7);
        puVar21 = pBVar8->data + uVar12 + lVar41;
        for (; (bVar48 = uVar20 != 0, uVar20 = uVar20 - 1, uVar12 = (ulong)(uVar33 & 0x1f), bVar48
               && (uVar12 = uVar28, *(uint8_t *)((long)piVar19 + uVar28) == *puVar21));
            uVar28 = uVar28 + 1) {
          puVar21 = puVar21 + 1;
        }
      }
      else {
        uVar20 = *(ulong *)(pBVar8->data + uVar12 + lVar41);
        if (uVar20 == *(ulong *)((long)piVar19 + uVar12)) goto code_r0x00110144;
        uVar20 = *(ulong *)((long)piVar19 + uVar12) ^ uVar20;
        uVar28 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar12 = (uVar28 >> 3 & 0x1fffffff) + uVar12;
      }
      if (((uVar12 != 0) && (uVar18 < (params->dictionary).cutoffTransformsCount + uVar12)) &&
         (uVar18 = (ulong)(uVar5 >> 5) + uVar47 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar18 - uVar12) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar18 - uVar12) * 4 << (pBVar8->size_bits_by_length[uVar18] & 0x3f)),
         uVar18 <= uVar6)) {
        iVar10 = 0x1f;
        if ((uint)uVar18 != 0) {
          for (; (uint)uVar18 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        uVar28 = (uVar12 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
        if (uVar46 <= uVar28) {
          iVar25 = uVar36 - (int)uVar12;
          local_98 = local_98 + 1;
          *(ulong *)(hasher + 0x20) = local_98;
          uVar46 = uVar28;
          uVar13 = uVar12;
          uVar44 = uVar18;
        }
      }
    }
  }
  lVar42 = lVar42 + 1;
  uVar38 = uVar38 + 1;
  goto LAB_001100a5;
LAB_0011025b:
  if (uVar46 < local_128 + 0xaf) {
    uVar39 = uVar14;
    uVar13 = uVar11;
    uVar44 = local_f8;
    uVar40 = uVar30;
    uVar47 = uVar4;
    iVar25 = iVar24;
    if (uVar30 < uVar4) {
      uVar47 = uVar30;
    }
    goto LAB_001102d6;
  }
  uVar39 = uVar31 + 4;
  if (local_a4 == 3) goto LAB_001102d6;
  uVar39 = uVar14 + 1;
  local_a4 = local_a4 + 1;
  uVar38 = uVar30 + 5;
  uVar22 = uVar22 - 1;
  uVar11 = uVar13;
  uVar14 = uVar39;
  uVar30 = uVar40;
  local_128 = uVar46;
  local_f8 = uVar44;
  iVar24 = iVar25;
  if (uVar1 <= uVar38) goto LAB_001102d6;
  goto LAB_0010fca1;
LAB_001102d6:
  if (uVar47 < uVar44) {
LAB_001102f6:
    uVar31 = uVar44 + 0xf;
  }
  else {
    if (uVar44 == (long)*dist_cache) {
      uVar31 = 0;
      goto LAB_00110394;
    }
    uVar31 = 1;
    if (uVar44 != (long)dist_cache[1]) {
      uVar31 = (uVar44 + 3) - (long)*dist_cache;
      if (uVar31 < 7) {
        bVar15 = (byte)((int)uVar31 << 2);
        uVar36 = 0x9750468;
      }
      else {
        uVar31 = (uVar44 + 3) - (long)dist_cache[1];
        if (6 < uVar31) {
          uVar31 = 2;
          if ((uVar44 != (long)dist_cache[2]) && (uVar31 = 3, uVar44 != (long)dist_cache[3]))
          goto LAB_001102f6;
          goto LAB_001102fa;
        }
        bVar15 = (byte)((int)uVar31 << 2);
        uVar36 = 0xfdb1ace;
      }
      uVar31 = (ulong)(uVar36 >> (bVar15 & 0x1f) & 0xf);
    }
  }
LAB_001102fa:
  if ((uVar44 <= uVar47) && (uVar31 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar9 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar9;
    iVar24 = (int)uVar44;
    *dist_cache = iVar24;
    uVar36 = *(uint *)(hasher + 0x10);
    if (4 < (int)uVar36) {
      dist_cache[4] = iVar24 + -1;
      dist_cache[5] = iVar24 + 1;
      dist_cache[6] = iVar24 + -2;
      dist_cache[7] = iVar24 + 2;
      dist_cache[8] = iVar24 + -3;
      dist_cache[9] = iVar24 + 3;
      if (10 < uVar36) {
        iVar24 = (int)uVar9;
        dist_cache[10] = iVar24 + -1;
        dist_cache[0xb] = iVar24 + 1;
        dist_cache[0xc] = iVar24 + -2;
        dist_cache[0xd] = iVar24 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar24 + 3,iVar24 + -3);
      }
    }
  }
LAB_00110394:
  uVar36 = (uint)uVar39;
  local_c8->insert_len_ = uVar36;
  local_110 = (uint)uVar13;
  local_c8->copy_len_ = iVar25 << 0x19 | local_110;
  uVar30 = (ulong)(params->dist).num_direct_distance_codes;
  uVar14 = uVar30 + 0x10;
  uVar26 = 0;
  if (uVar14 <= uVar31) {
    uVar33 = (params->dist).distance_postfix_bits;
    bVar15 = (byte)uVar33;
    uVar30 = ((uVar31 - uVar30) + (4L << (bVar15 & 0x3f))) - 0x10;
    uVar35 = 0x1f;
    uVar27 = (uint)uVar30;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar35 == 0; uVar35 = uVar35 - 1) {
      }
    }
    uVar35 = (uVar35 ^ 0xffffffe0) + 0x1f;
    uVar22 = (ulong)((uVar30 >> ((ulong)uVar35 & 0x3f) & 1) != 0);
    lVar45 = (ulong)uVar35 - (ulong)uVar33;
    uVar31 = (~(-1 << (bVar15 & 0x1f)) & uVar27) + uVar14 +
             (uVar22 + lVar45 * 2 + 0xfffe << (bVar15 & 0x3f)) | lVar45 * 0x400;
    uVar26 = (uint32_t)(uVar30 - (uVar22 + 2 << ((byte)uVar35 & 0x3f)) >> (bVar15 & 0x3f));
  }
  local_c8->dist_prefix_ = (uint16_t)uVar31;
  local_c8->dist_extra_ = uVar26;
  if (5 < uVar39) {
    if (uVar39 < 0x82) {
      uVar36 = 0x1f;
      uVar33 = (uint)(uVar39 - 2);
      if (uVar33 != 0) {
        for (; uVar33 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar36 = (int)(uVar39 - 2 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar36 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar39 < 0x842) {
      uVar33 = 0x1f;
      if (uVar36 - 0x42 != 0) {
        for (; uVar36 - 0x42 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar36 = (uVar33 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar36 = 0x15;
      if (0x1841 < uVar39) {
        uVar36 = (uint)(ushort)(0x17 - (uVar39 < 0x5842));
      }
    }
  }
  local_110 = iVar25 + local_110;
  if (local_110 < 10) {
    uVar33 = local_110 - 2;
  }
  else if (local_110 < 0x86) {
    local_110 = local_110 - 6;
    uVar33 = 0x1f;
    if (local_110 != 0) {
      for (; local_110 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (local_110 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar33 ^ 0xffffffe0) * 2
             + 0x42;
  }
  else {
    uVar33 = 0x17;
    if (local_110 < 0x846) {
      uVar33 = 0x1f;
      if (local_110 - 0x46 != 0) {
        for (; local_110 - 0x46 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar33;
  uVar32 = (uVar5 & 7) + ((ushort)uVar36 & 7) * 8;
  if ((((uVar31 & 0x3ff) == 0) && ((ushort)uVar36 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar32 = uVar32 + 0x40;
    }
  }
  else {
    iVar24 = ((uVar36 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3);
    uVar32 = uVar32 + ((ushort)(0x520d40 >> ((char)iVar24 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar24 * 0x40 + 0x40;
  }
  local_c8->cmd_prefix_ = uVar32;
  *num_literals = *num_literals + uVar39;
  position = uVar13 + uVar40;
  uVar31 = sVar16;
  if (position < sVar16) {
    uVar31 = position;
  }
  uVar30 = uVar40 + 2;
  if (uVar44 < uVar13 >> 2) {
    uVar14 = position + uVar44 * -4;
    if (uVar14 < uVar30) {
      uVar14 = uVar30;
    }
    uVar30 = uVar14;
    if (uVar31 < uVar14) {
      uVar30 = uVar31;
    }
  }
  uVar14 = uVar13 * 2 + uVar40 + lVar17;
  local_c8 = local_c8 + 1;
  for (; uVar30 < uVar31; uVar30 = uVar30 + 1) {
    uVar36 = (uint)(*(int *)(ringbuffer + (uVar30 & ringbuffer_mask)) * 0x1e35a7bd) >>
             (hasher[0x38] & 0x1f);
    uVar5 = *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40);
    *(int *)(hasher + (ulong)(uVar36 << (hasher[8] & 0x1f)) * 4 +
                      (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 +
                      *(long *)(hasher + 0x28) * 2 + 0x40) = (int)uVar30;
    *(ushort *)(hasher + (ulong)uVar36 * 2 + 0x40) = uVar5 + 1;
  }
  uVar31 = 0;
  goto LAB_0010f5a4;
code_r0x00110144:
  uVar12 = uVar12 + 8;
  goto LAB_00110129;
code_r0x0010ff4f:
  lVar41 = lVar41 + -8;
  uVar39 = uVar39 + 1;
  goto LAB_0010ff37;
code_r0x0010fda6:
  lVar42 = lVar42 + -8;
  uVar46 = uVar46 + 1;
  goto LAB_0010fd85;
code_r0x0010fa2e:
  uVar47 = uVar47 + 8;
  goto LAB_0010fa13;
code_r0x0010f878:
  lVar41 = lVar41 + -8;
  uVar39 = uVar39 + 1;
  goto LAB_0010f85f;
code_r0x0010f6ba:
  lVar45 = lVar45 + -8;
  uVar34 = uVar34 + 1;
  goto LAB_0010f69d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}